

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O3

void __thiscall clunk::HashEntry::SetStalemate(HashEntry *this,uint64_t entryKey)

{
  if (entryKey != 0) {
    this->key = entryKey;
    this->moveBits = 0;
    this->depth = '\0';
    this->flags = '\x02';
    this->score = 0;
    return;
  }
  __assert_fail("entryKey",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                ,0x85,"void clunk::HashEntry::SetStalemate(const uint64_t)");
}

Assistant:

void SetStalemate(const uint64_t entryKey) {
    assert(entryKey);
    key      = entryKey;
    moveBits = 0;
    depth    = 0;
    flags    = HashEntry::Stalemate;
    score    = 0;
  }